

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> *
google::protobuf::internal::anon_unknown_36::GenerateFieldNames
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          Descriptor *descriptor,
          Span<const_google::protobuf::internal::TailCallTableInfo::FieldEntryInfo> entries,
          MessageOptions *message_options,
          Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> fields)

{
  ushort uVar1;
  pointer puVar2;
  ushort *puVar3;
  long lVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar5;
  byte bVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RAX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar7;
  ulong uVar8;
  long lVar9;
  pointer pFVar10;
  long lVar11;
  uint uVar12;
  pointer __dest;
  long lVar13;
  allocator_type local_4a;
  value_type_conflict5 local_49;
  char *local_48;
  char *local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_38;
  
  uVar8 = entries.len_;
  pFVar10 = entries.ptr_;
  if (uVar8 != 0) {
    lVar4 = uVar8 * 0x18;
    lVar11 = 0;
    in_RAX = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
    do {
      if ((&pFVar10->utf8_check_mode)[lVar11] != kNone) {
        in_RAX = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 ((long)&(in_RAX->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                         ._M_impl.super__Vector_impl_data._M_start +
                 (ulong)**(ushort **)(*(long *)((long)&pFVar10->field + lVar11) + 8));
      }
      lVar11 = lVar11 + 0x18;
    } while (lVar4 != lVar11);
    if (in_RAX != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
      local_40 = (descriptor->all_names_).payload_;
      uVar1 = *(ushort *)(local_40 + 2);
      local_38 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(ulong)uVar1;
      local_48 = local_40 + ~(ulong)local_38;
      uVar12 = 0xff;
      if (uVar1 < 0xff) {
        uVar12 = (uint)uVar1;
      }
      local_49 = '\0';
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (__return_storage_ptr__,
                 (long)&(in_RAX->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish +
                 (ulong)uVar12 + (uVar8 & 0xfffffffffffffff8),&local_49,&local_4a);
      pvVar5 = local_38;
      puVar2 = (__return_storage_ptr__->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *puVar2 = (uchar)uVar12;
      bVar6 = 7;
      lVar9 = 0;
      lVar11 = 0;
      do {
        lVar13 = lVar11;
        if ((&pFVar10->utf8_check_mode)[lVar9] != kNone) {
          puVar2[lVar13 + 1] = **(uchar **)(*(long *)((long)&pFVar10->field + lVar9) + 8);
        }
        bVar6 = bVar6 + 7;
        lVar11 = lVar13 + 1;
        lVar9 = lVar9 + 0x18;
      } while (lVar4 != lVar9);
      __dest = puVar2 + lVar11 + (ulong)(bVar6 & 7) + 1;
      if ((uint)local_38 < 0x100) {
        pvVar7 = local_38;
        if (local_38 != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
          pvVar7 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   memcpy(__dest,local_48,(size_t)local_38);
          __dest = puVar2 + (bVar6 & 7) + (long)pvVar5 + lVar13 + 2;
        }
      }
      else {
        memcpy(__dest,local_48,0x7e);
        uVar12 = bVar6 & 7;
        lVar9 = lVar11 + (ulong)uVar12;
        (puVar2 + lVar9 + 0x7f)[0] = '.';
        (puVar2 + lVar9 + 0x7f)[1] = '.';
        puVar2[lVar9 + 0x81] = '.';
        pvVar7 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 memcpy(puVar2 + lVar9 + 0x82,local_40 + -0x7f,0x7e);
        __dest = puVar2 + lVar11 + (ulong)uVar12 + 0x100;
      }
      lVar11 = 0;
      do {
        if ((&pFVar10->utf8_check_mode)[lVar11] != kNone) {
          pvVar7 = *(vector<unsigned_char,_std::allocator<unsigned_char>_> **)
                    ((long)&pFVar10->field + lVar11);
          puVar3 = (ushort *)
                   (pvVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          uVar8 = (ulong)*puVar3;
          if (uVar8 != 0) {
            pvVar7 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     memcpy(__dest,(void *)((long)puVar3 + ~uVar8),uVar8);
            __dest = __dest + uVar8;
          }
        }
        lVar11 = lVar11 + 0x18;
      } while (lVar4 != lVar11);
      return pvVar7;
    }
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return in_RAX;
}

Assistant:

std::vector<uint8_t> GenerateFieldNames(
    const Descriptor* descriptor,
    const absl::Span<const TailCallTableInfo::FieldEntryInfo> entries,
    const TailCallTableInfo::MessageOptions& message_options,
    absl::Span<const TailCallTableInfo::FieldOptions> fields) {
  static constexpr size_t kMaxNameLength = 255;

  size_t field_name_total_size = 0;
  const auto for_each_field_name = [&](auto with_name, auto no_name) {
    for (const auto& entry : entries) {
      // We only need field names for reporting UTF-8 parsing errors, so we only
      // emit them for string fields with Utf8 transform specified.
      if (entry.utf8_check_mode != cpp::Utf8CheckMode::kNone) {
        with_name(absl::string_view(entry.field->name()));
      } else {
        no_name();
      }
    }
  };

  for_each_field_name([&](auto name) { field_name_total_size += name.size(); },
                      [] {});

  // No names needed. Omit the whole table.
  if (field_name_total_size == 0) {
    return {};
  }

  const absl::string_view message_name = descriptor->full_name();
  uint8_t message_name_size =
      static_cast<uint8_t>(std::min(message_name.size(), kMaxNameLength));
  size_t total_byte_size =
      ((/* message */ 1 + /* fields */ entries.size() + /* round up */ 7) &
       ~7) +
      message_name_size + field_name_total_size;

  std::vector<uint8_t> out_vec(total_byte_size, uint8_t{0});
  uint8_t* out_it = out_vec.data();

  // First, we output the size of each string, as an unsigned byte. The first
  // string is the message name.
  int count = 1;
  *out_it++ = message_name_size;
  for_each_field_name(
      [&](auto name) {
        *out_it++ = static_cast<uint8_t>(name.size());
        ++count;
      },
      [&] {
        ++out_it;
        ++count;
      });
  // align to an 8-byte boundary
  out_it += -count & 7;

  const auto append = [&](absl::string_view str) {
    if (!str.empty()) {
      memcpy(out_it, str.data(), str.size());
      out_it += str.size();
    }
  };

  // The message name is stored at the beginning of the string
  if (message_name.size() > kMaxNameLength) {
    static constexpr int kNameHalfLength = (kMaxNameLength - 3) / 2;
    append(message_name.substr(0, kNameHalfLength));
    append("...");
    append(message_name.substr(message_name.size() - kNameHalfLength));
  } else {
    append(message_name);
  }
  // Then we output the actual field names
  for_each_field_name([&](auto name) { append(name); }, [] {});

  return out_vec;
}